

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

TRef rec_upvalue(jit_State *J,uint32_t uv,TRef val)

{
  char cVar1;
  long lVar2;
  lua_State *plVar3;
  TRef TVar4;
  TRef TVar5;
  long lVar6;
  GCproto *pGVar7;
  uint uVar8;
  ulong uVar9;
  IROpT IVar10;
  uint uVar11;
  int slot;
  ulong uVar12;
  IRRef1 IVar13;
  int iVar14;
  uint uVar15;
  bool bVar16;
  
  uVar12 = (ulong)*(uint *)((long)J->fn + (ulong)uv * 4 + 0x14);
  TVar4 = getcurrf(J);
  IVar13 = (IRRef1)TVar4;
  if (*(char *)(uVar12 + 7) == '\0') {
LAB_0012fbcd:
    uVar15 = 0;
  }
  else {
    uVar15 = *(uint *)(uVar12 + 0x10);
    uVar8 = ((uint *)(ulong)uVar15)[1];
    if ((uVar8 + 0xd < 2) || (uVar8 == 0xfffffff9)) {
      bVar16 = true;
    }
    else if (uVar8 == 0xfffffff5) {
      uVar9 = (ulong)*(uint *)(ulong)uVar15;
      uVar15 = 0;
      bVar16 = false;
      if ((*(byte *)(uVar9 + 4) & 0x90) == 0) {
        lVar2 = *(long *)(ulong)J[-1].bpropcache[9].mode;
        lVar6 = (ulong)*(ushort *)(uVar9 + 6) * 0x10;
        if (0x5fffffff < *(uint *)(lVar2 + lVar6)) goto LAB_0012fbc2;
        uVar15 = (uint)(*(uint *)(lVar2 + lVar6 + 4) < 0x11);
        bVar16 = false;
      }
    }
    else {
LAB_0012fbc2:
      bVar16 = false;
      uVar15 = 1;
    }
    if (bVar16) goto LAB_0012fbcd;
  }
  if (uVar15 == 0) {
    TVar4 = 0;
    goto LAB_0012fc65;
  }
  if ((short)IVar13 < 0) {
    pGVar7 = J->pt;
    if (pGVar7->flags < 0x60) {
      TVar4 = lj_ir_kgc(J,(GCobj *)J->fn,IRT_FUNC);
      (J->fold).ins.field_0.ot = 0x888;
      (J->fold).ins.field_0.op1 = IVar13;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
      lj_opt_fold(J);
      J->base[-1] = TVar4 | 0x10000;
      goto LAB_0012fc46;
    }
    bVar16 = false;
  }
  else {
LAB_0012fc46:
    IVar13 = (IRRef1)TVar4;
    TVar4 = lj_record_constify(J,(cTValue *)(ulong)*(uint *)(uVar12 + 0x10));
    pGVar7 = (GCproto *)(ulong)TVar4;
    bVar16 = TVar4 != 0;
  }
  TVar4 = (TRef)pGVar7;
  if (bVar16) {
    return TVar4;
  }
LAB_0012fc65:
  uVar15 = *(uint *)(uVar12 + 0x14);
  cVar1 = *(char *)(uVar12 + 6);
  IVar10 = 0x3d85;
  if (cVar1 == '\0') {
    uVar8 = *(uint *)(uVar12 + 0x10);
    plVar3 = J->L;
    IVar10 = 0x3c85;
    if (((plVar3->stack).ptr32 <= uVar8) && (uVar8 < (plVar3->maxstack).ptr32)) {
      iVar14 = (int)((ulong)uVar8 - (long)(plVar3->base + -J->baseslot) >> 3);
      if (-1 < iVar14) {
        slot = iVar14 - J->baseslot;
        if (val == 0) {
          TVar4 = J->base[slot];
          if (TVar4 == 0) {
            TVar4 = sload(J,slot);
          }
        }
        else {
          J->base[slot] = val;
          TVar4 = 0;
          if ((int)J->maxslot <= slot) {
            J->maxslot = slot + 1;
          }
        }
      }
      if (-1 < iVar14) {
        return TVar4;
      }
    }
  }
  uVar8 = uVar15 + 0xfb3ee249;
  iVar14 = (uVar15 ^ uVar8) - (uVar8 * 0x4000 | uVar8 >> 0x12);
  (J->fold).ins.field_0.ot = IVar10;
  (J->fold).ins.field_0.op1 = IVar13;
  (J->fold).ins.field_0.op2 =
       ((ushort)(uVar8 >> 0xd) ^ (ushort)iVar14) - (ushort)((uint)iVar14 >> 0x13) & 0xff |
       (ushort)(uv << 8);
  TVar4 = lj_opt_fold(J);
  IVar13 = (IRRef1)TVar4;
  if (val == 0) {
    uVar15 = *(uint *)((ulong)*(uint *)(uVar12 + 0x10) + 4);
    uVar8 = 3;
    if ((uVar15 & 0xffff8000) != 0xffff0000) {
      uVar8 = ~uVar15;
    }
    uVar11 = 0xe;
    if (0xfffefffe < uVar15) {
      uVar11 = uVar8;
    }
    (J->fold).ins.field_0.ot = (ushort)uVar11 | 0x4280;
    (J->fold).ins.field_0.op1 = IVar13;
    (J->fold).ins.field_0.op2 = 0;
    TVar5 = lj_opt_fold(J);
    TVar4 = uVar11 * 0xffffff + 0x7fff;
    if (2 < uVar11) {
      TVar4 = TVar5;
    }
  }
  else {
    if ((val >> 0x18 & 0x1f) - 0xf < 5) {
      (J->fold).ins.field_0.op1 = (IRRef1)val;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x550e01d3;
      val = lj_opt_fold(J);
    }
    uVar15 = val >> 0x18 & 0x1f;
    (J->fold).ins.field_0.ot = (short)uVar15 + 0x4900;
    (J->fold).ins.field_0.op1 = IVar13;
    (J->fold).ins.field_0.op2 = (IRRef1)val;
    lj_opt_fold(J);
    if ((cVar1 != '\0') && (uVar15 - 4 < 9)) {
      (J->fold).ins.field_0.ot = 0x5300;
      (J->fold).ins.field_0.op1 = IVar13;
      (J->fold).ins.field_0.op2 = (IRRef1)val;
      lj_opt_fold(J);
    }
    J->needsnap = '\x01';
    TVar4 = 0;
  }
  return TVar4;
}

Assistant:

static TRef rec_upvalue(jit_State *J, uint32_t uv, TRef val)
{
  GCupval *uvp = &gcref(J->fn->l.uvptr[uv])->uv;
  TRef fn = getcurrf(J);
  IRRef uref;
  int needbarrier = 0;
  if (rec_upvalue_constify(J, uvp)) {  /* Try to constify immutable upvalue. */
    TRef tr, kfunc;
    lua_assert(val == 0);
    if (!tref_isk(fn)) {  /* Late specialization of current function. */
      if (J->pt->flags >= PROTO_CLC_POLY)
	goto noconstify;
      kfunc = lj_ir_kfunc(J, J->fn);
      emitir(IRTG(IR_EQ, IRT_FUNC), fn, kfunc);
      J->base[-1] = TREF_FRAME | kfunc;
      fn = kfunc;
    }
    tr = lj_record_constify(J, uvval(uvp));
    if (tr)
      return tr;
  }
noconstify:
  /* Note: this effectively limits LJ_MAX_UPVAL to 127. */
  uv = (uv << 8) | (hashrot(uvp->dhash, uvp->dhash + HASH_BIAS) & 0xff);
  if (!uvp->closed) {
    /* In current stack? */
    if (uvval(uvp) >= tvref(J->L->stack) &&
	uvval(uvp) < tvref(J->L->maxstack)) {
      int32_t slot = (int32_t)(uvval(uvp) - (J->L->base - J->baseslot));
      if (slot >= 0) {  /* Aliases an SSA slot? */
	slot -= (int32_t)J->baseslot;  /* Note: slot number may be negative! */
	/* NYI: add IR to guard that it's still aliasing the same slot. */
	if (val == 0) {
	  return getslot(J, slot);
	} else {
	  J->base[slot] = val;
	  if (slot >= (int32_t)J->maxslot) J->maxslot = (BCReg)(slot+1);
	  return 0;
	}
      }
    }
    uref = tref_ref(emitir(IRTG(IR_UREFO, IRT_P32), fn, uv));
  } else {
    needbarrier = 1;
    uref = tref_ref(emitir(IRTG(IR_UREFC, IRT_P32), fn, uv));
  }
  if (val == 0) {  /* Upvalue load */
    IRType t = itype2irt(uvval(uvp));
    TRef res = emitir(IRTG(IR_ULOAD, t), uref, 0);
    if (irtype_ispri(t)) res = TREF_PRI(t);  /* Canonicalize primitive refs. */
    return res;
  } else {  /* Upvalue store. */
    /* Convert int to number before storing. */
    if (!LJ_DUALNUM && tref_isinteger(val))
      val = emitir(IRTN(IR_CONV), val, IRCONV_NUM_INT);
    emitir(IRT(IR_USTORE, tref_type(val)), uref, val);
    if (needbarrier && tref_isgcv(val))
      emitir(IRT(IR_OBAR, IRT_NIL), uref, val);
    J->needsnap = 1;
    return 0;
  }
}